

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::ParseOption
          (CSVReaderOptions *this,ClientContext *context,string *key,Value *val)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar1;
  case_insensitive_map_t<idx_t> *pcVar2;
  LogicalTypeId LVar3;
  pointer pVVar4;
  key_type *pkVar5;
  element_type *peVar6;
  bool bVar7;
  mapped_type *this_00;
  vector<duckdb::Value,_true> *pvVar8;
  string *psVar9;
  const_reference pvVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  iterator iVar14;
  string *__x;
  LogicalType *pLVar15;
  BinderException *pBVar16;
  size_type sVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range5;
  key_type *__k;
  pointer pVVar18;
  element_type *str;
  vector<duckdb::LogicalType,_true> *pvVar19;
  ulong uVar20;
  allocator local_231;
  CSVReaderOptions *local_230;
  LogicalType candidate_type;
  LogicalType def_type;
  map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
  candidate_types;
  __node_base_ptr p_Stack_1b8;
  Value *local_1b0;
  ClientContext *local_1a8;
  string loption;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_230 = this;
  local_1a8 = context;
  StringUtil::Lower(&loption,key);
  bVar7 = StoreUserDefinedParameter(&loption);
  if (bVar7) {
    Value::ToSQLString_abi_cxx11_((string *)&candidate_types,val);
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&local_230->user_defined_parameters,&loption);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&candidate_types);
    ::std::__cxx11::string::~string((string *)&candidate_types);
  }
  bVar7 = ::std::operator==(&loption,"columns");
  if (bVar7) {
    if ((local_230->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_230->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&candidate_types,"read_csv column_names/names can only be supplied once",
                 (allocator *)&candidate_type);
      BinderException::BinderException(pBVar16,(string *)&candidate_types);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_230->columns_set = true;
    if ((val->type_).id_ != STRUCT) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&candidate_types,"read_csv columns requires a struct as input",
                 (allocator *)&candidate_type);
      BinderException::BinderException(pBVar16,(string *)&candidate_types);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1b0 = val;
    pvVar8 = StructValue::GetChildren(val);
    pvVar1 = &local_230->name_list;
    pcVar2 = &local_230->sql_types_per_column;
    pvVar19 = &local_230->sql_type_list;
    for (uVar20 = 0;
        uVar20 < (ulong)((long)(pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                               .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                               .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 6); uVar20 = uVar20 + 1)
    {
      psVar9 = StructType::GetChildName_abi_cxx11_(&local_1b0->type_,uVar20);
      pvVar10 = vector<duckdb::Value,_true>::get<true>(pvVar8,uVar20);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pvVar1,psVar9);
      if ((pvVar10->type_).id_ != VARCHAR) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&candidate_types,"read_csv requires a type specification as string",
                   (allocator *)&candidate_type);
        BinderException::BinderException(pBVar16,(string *)&candidate_types);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pmVar11 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)pcVar2,psVar9);
      *pmVar11 = uVar20;
      psVar9 = StringValue::Get_abi_cxx11_(pvVar10);
      TransformStringToLogicalType((LogicalType *)&candidate_types,psVar9,local_1a8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
      emplace_back<duckdb::LogicalType>
                (&pvVar19->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (LogicalType *)&candidate_types);
      LogicalType::~LogicalType((LogicalType *)&candidate_types);
    }
    if ((local_230->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (local_230->name_list).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&candidate_types,"read_csv requires at least a single column as input!",
                 (allocator *)&candidate_type);
      BinderException::BinderException(pBVar16,(string *)&candidate_types);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar7 = ::std::operator==(&loption,"auto_type_candidates");
    if (bVar7) {
      pvVar19 = &local_230->auto_type_candidates;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
                (&pvVar19->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &candidate_types._M_t._M_impl.super__Rb_tree_header._M_header;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      LogicalType::LogicalType(&candidate_type,VARCHAR);
      LogicalType::LogicalType(&def_type,VARCHAR);
      local_231 = (allocator)GetCandidateSpecificity(&def_type);
      pmVar12 = ::std::
                map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                ::operator[](&candidate_types,(key_type_conflict5 *)&local_231);
      LogicalType::operator=(pmVar12,&candidate_type);
      LogicalType::~LogicalType(&def_type);
      LogicalType::~LogicalType(&candidate_type);
      LogicalType::LogicalType(&candidate_type,SQLNULL);
      LogicalType::LogicalType(&def_type,SQLNULL);
      local_231 = (allocator)GetCandidateSpecificity(&def_type);
      pmVar12 = ::std::
                map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                ::operator[](&candidate_types,(key_type_conflict5 *)&local_231);
      LogicalType::operator=(pmVar12,&candidate_type);
      LogicalType::~LogicalType(&def_type);
      LogicalType::~LogicalType(&candidate_type);
      if ((val->type_).id_ != LIST) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&candidate_type,"read_csv auto_types requires a list as input",
                   (allocator *)&def_type);
        BinderException::BinderException(pBVar16,(string *)&candidate_type);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar8 = ListValue::GetChildren(val);
      pVVar18 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar4 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar18 == pVVar4) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&candidate_type,"auto_type_candidates requires at least one type",
                   (allocator *)&def_type);
        BinderException::BinderException(pBVar16,(string *)&candidate_type);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      for (; pVVar18 != pVVar4; pVVar18 = pVVar18 + 1) {
        if ((pVVar18->type_).id_ != VARCHAR) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&candidate_type,
                     "auto_type_candidates requires a type specification as string",
                     (allocator *)&def_type);
          BinderException::BinderException(pBVar16,(string *)&candidate_type);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        psVar9 = StringValue::Get_abi_cxx11_(pVVar18);
        TransformStringToLogicalType(&candidate_type,psVar9,local_1a8);
        def_type.id_ = GetCandidateSpecificity(&candidate_type);
        pmVar12 = ::std::
                  map<unsigned_char,_duckdb::LogicalType,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
                  ::operator[](&candidate_types,&def_type.id_);
        LogicalType::operator=(pmVar12,&candidate_type);
        LogicalType::~LogicalType(&candidate_type);
      }
      for (p_Var13 = candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &candidate_types._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13)) {
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        emplace_back<duckdb::LogicalType&>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)pvVar19,
                   (LogicalType *)&p_Var13[1]._M_parent);
      }
      ::std::
      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_duckdb::LogicalType>,_std::_Select1st<std::pair<const_unsigned_char,_duckdb::LogicalType>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_duckdb::LogicalType>_>_>
      ::~_Rb_tree(&candidate_types._M_t);
    }
    else {
      bVar7 = ::std::operator==(&loption,"column_names");
      if (!bVar7) {
        bVar7 = ::std::operator==(&loption,"names");
        if (!bVar7) {
          bVar7 = ::std::operator==(&loption,"column_types");
          if (!bVar7) {
            bVar7 = ::std::operator==(&loption,"types");
            if (!bVar7) {
              bVar7 = ::std::operator==(&loption,"dtypes");
              if (!bVar7) {
                bVar7 = ::std::operator==(&loption,"all_varchar");
                if (bVar7) {
                  bVar7 = GetBooleanValue(&loption,val);
                  local_230->all_varchar = bVar7;
                }
                else {
                  bVar7 = ::std::operator==(&loption,"normalize_names");
                  if (bVar7) {
                    bVar7 = GetBooleanValue(&loption,val);
                    local_230->normalize_names = bVar7;
                  }
                  else {
                    SetReadOption(local_230,&loption,val,&local_230->name_list);
                  }
                }
                goto LAB_019c7517;
              }
            }
          }
          LVar3 = (val->type_).id_;
          if ((LVar3 & ~SQLNULL) != STRUCT) {
            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&candidate_types,"read_csv %s requires a struct or list as input",
                       (allocator *)&candidate_type);
            ::std::__cxx11::string::string((string *)&local_f0,(string *)key);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar16,(string *)&candidate_types,&local_f0);
            __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((local_230->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (local_230->sql_type_list).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&candidate_types,
                       "read_csv column_types/types/dtypes can only be supplied once",
                       (allocator *)&candidate_type);
            BinderException::BinderException(pBVar16,(string *)&candidate_types);
            __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          candidate_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          candidate_type.id_ = INVALID;
          candidate_type.physical_type_ = ~INVALID;
          candidate_type._2_6_ = 0;
          candidate_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_1b0 = (Value *)key;
          if (LVar3 == STRUCT) {
            pvVar8 = StructValue::GetChildren(val);
            pcVar2 = &local_230->sql_types_per_column;
            for (uVar20 = 0;
                uVar20 < (ulong)((long)(pvVar8->
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar8->
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6);
                uVar20 = uVar20 + 1) {
              psVar9 = StructType::GetChildName_abi_cxx11_(&val->type_,uVar20);
              pvVar10 = vector<duckdb::Value,_true>::get<true>(pvVar8,uVar20);
              if ((pvVar10->type_).id_ != VARCHAR) {
                pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&candidate_types,
                           "read_csv %s requires a type specification as string",
                           (allocator *)&def_type);
                ::std::__cxx11::string::string((string *)&local_110,(string *)local_1b0);
                BinderException::BinderException<std::__cxx11::string>
                          (pBVar16,(string *)&candidate_types,&local_110);
                __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              __x = StringValue::Get_abi_cxx11_(pvVar10);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&candidate_type,__x);
              pmVar11 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)pcVar2,psVar9);
              *pmVar11 = uVar20;
            }
          }
          else {
            pLVar15 = ListType::GetChildType(&val->type_);
            if (pLVar15->id_ != VARCHAR) {
              pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&candidate_types,
                         "read_csv %s requires a list of types (varchar) as input",
                         (allocator *)&def_type);
              ::std::__cxx11::string::string((string *)&local_130,(string *)key);
              BinderException::BinderException<std::__cxx11::string>
                        (pBVar16,(string *)&candidate_types,&local_130);
              __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar8 = ListValue::GetChildren(val);
            pVVar4 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pVVar18 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start; pVVar18 != pVVar4;
                pVVar18 = pVVar18 + 1) {
              psVar9 = StringValue::Get_abi_cxx11_(pVVar18);
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&candidate_type,psVar9);
            }
          }
          pvVar19 = &local_230->sql_type_list;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
                    (&pvVar19->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                     (long)candidate_type.type_info_.internal.
                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr - candidate_type._0_8_ >> 5);
          peVar6 = candidate_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          for (str = (element_type *)candidate_type._0_8_; str != peVar6;
              str = (element_type *)
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&str->alias + 1)) {
            TransformStringToLogicalType(&def_type,(string *)str,local_1a8);
            if (def_type.id_ == USER) {
              pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&candidate_types,
                         "Unrecognized type \"%s\" for read_csv %s definition",&local_231);
              ::std::__cxx11::string::string((string *)&local_150,(string *)str);
              ::std::__cxx11::string::string((string *)&local_170,(string *)local_1b0);
              BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                        (pBVar16,(string *)&candidate_types,&local_150,&local_170);
              __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
            emplace_back<duckdb::LogicalType>
                      (&pvVar19->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                       &def_type);
            LogicalType::~LogicalType(&def_type);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&candidate_type);
          goto LAB_019c7517;
        }
      }
      candidate_types._M_t._M_impl._0_8_ = &p_Stack_1b8;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           CONCAT44(candidate_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                    0x3f800000);
      candidate_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Stack_1b8 = (__node_base_ptr)0x0;
      if ((local_230->name_list).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (local_230->name_list).
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&candidate_type,"read_csv column_names/names can only be supplied once"
                   ,(allocator *)&def_type);
        BinderException::BinderException(pBVar16,(string *)&candidate_type);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (val->is_null == true) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&candidate_type,"read_csv %s cannot be NULL",(allocator *)&def_type);
        ::std::__cxx11::string::string((string *)&local_50,(string *)key);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar16,(string *)&candidate_type,&local_50);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar8 = ListValue::GetChildren(val);
      pvVar1 = &local_230->name_list;
      pVVar4 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar18 = (pvVar8->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start; pVVar18 != pVVar4; pVVar18 = pVVar18 + 1) {
        if (pVVar18->is_null == true) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&candidate_type,"read_csv %s parameter cannot have a NULL value",
                     (allocator *)&def_type);
          ::std::__cxx11::string::string((string *)&local_70,(string *)key);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar16,(string *)&candidate_type,&local_70);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        psVar9 = StringValue::Get_abi_cxx11_(pVVar18);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pvVar1,psVar9);
      }
      pkVar5 = (local_230->name_list).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (local_230->name_list).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pkVar5; __k = __k + 1) {
        sVar17 = 0;
        while( true ) {
          if (__k->_M_string_length == sVar17) {
            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&candidate_type,
                       "read_csv %s cannot have empty (or all whitespace) value",
                       (allocator *)&def_type);
            ::std::__cxx11::string::string((string *)&local_90,(string *)key);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar16,(string *)&candidate_type,&local_90);
            __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar20 = (ulong)(byte)(__k->_M_dataplus)._M_p[sVar17];
          if ((0x20 < uVar20) || ((0x100003e00U >> (uVar20 & 0x3f) & 1) == 0)) break;
          sVar17 = sVar17 + 1;
        }
        iVar14 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&candidate_types,__k);
        if (iVar14.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&candidate_type,
                     "read_csv %s must have unique values. \"%s\" is repeated.",
                     (allocator *)&def_type);
          ::std::__cxx11::string::string((string *)&local_b0,(string *)key);
          ::std::__cxx11::string::string((string *)&local_d0,(string *)__k);
          BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                    (pBVar16,(string *)&candidate_type,&local_b0,&local_d0);
          __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&candidate_types,__k);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&candidate_types);
    }
  }
LAB_019c7517:
  ::std::__cxx11::string::~string((string *)&loption);
  return;
}

Assistant:

void CSVReaderOptions::ParseOption(ClientContext &context, const string &key, const Value &val) {
	auto loption = StringUtil::Lower(key);
	// skip variables that are specific to auto-detection
	if (StoreUserDefinedParameter(loption)) {
		user_defined_parameters[loption] = val.ToSQLString();
	}
	if (loption == "columns") {
		if (!name_list.empty()) {
			throw BinderException("read_csv column_names/names can only be supplied once");
		}
		columns_set = true;
		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::STRUCT) {
			throw BinderException("read_csv columns requires a struct as input");
		}
		auto &struct_children = StructValue::GetChildren(val);
		D_ASSERT(StructType::GetChildCount(child_type) == struct_children.size());
		for (idx_t i = 0; i < struct_children.size(); i++) {
			auto &name = StructType::GetChildName(child_type, i);
			auto &val = struct_children[i];
			name_list.push_back(name);
			if (val.type().id() != LogicalTypeId::VARCHAR) {
				throw BinderException("read_csv requires a type specification as string");
			}
			sql_types_per_column[name] = i;
			sql_type_list.emplace_back(TransformStringToLogicalType(StringValue::Get(val), context));
		}
		if (name_list.empty()) {
			throw BinderException("read_csv requires at least a single column as input!");
		}
	} else if (loption == "auto_type_candidates") {
		auto_type_candidates.clear();
		map<uint8_t, LogicalType> candidate_types;
		// We always have the extremes of Null and Varchar, so we can default to varchar if the
		// sniffer is not able to confidently detect that column type
		candidate_types[GetCandidateSpecificity(LogicalType::VARCHAR)] = LogicalType::VARCHAR;
		candidate_types[GetCandidateSpecificity(LogicalType::SQLNULL)] = LogicalType::SQLNULL;

		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::LIST) {
			throw BinderException("read_csv auto_types requires a list as input");
		}
		auto &list_children = ListValue::GetChildren(val);
		if (list_children.empty()) {
			throw BinderException("auto_type_candidates requires at least one type");
		}
		for (auto &child : list_children) {
			if (child.type().id() != LogicalTypeId::VARCHAR) {
				throw BinderException("auto_type_candidates requires a type specification as string");
			}
			auto candidate_type = TransformStringToLogicalType(StringValue::Get(child), context);
			candidate_types[GetCandidateSpecificity(candidate_type)] = candidate_type;
		}
		for (auto &candidate_type : candidate_types) {
			auto_type_candidates.emplace_back(candidate_type.second);
		}
	} else if (loption == "column_names" || loption == "names") {
		unordered_set<string> column_names;
		if (!name_list.empty()) {
			throw BinderException("read_csv column_names/names can only be supplied once");
		}
		if (val.IsNull()) {
			throw BinderException("read_csv %s cannot be NULL", key);
		}
		auto &children = ListValue::GetChildren(val);
		for (auto &child : children) {
			if (child.IsNull()) {
				throw BinderException("read_csv %s parameter cannot have a NULL value", key);
			}
			name_list.push_back(StringValue::Get(child));
		}
		for (auto &name : name_list) {
			bool empty = true;
			for (auto &c : name) {
				if (!StringUtil::CharacterIsSpace(c)) {
					empty = false;
					break;
				}
			}
			if (empty) {
				throw BinderException("read_csv %s cannot have empty (or all whitespace) value", key);
			}
			if (column_names.find(name) != column_names.end()) {
				throw BinderException("read_csv %s must have unique values. \"%s\" is repeated.", key, name);
			}
			column_names.insert(name);
		}
	} else if (loption == "column_types" || loption == "types" || loption == "dtypes") {
		auto &child_type = val.type();
		if (child_type.id() != LogicalTypeId::STRUCT && child_type.id() != LogicalTypeId::LIST) {
			throw BinderException("read_csv %s requires a struct or list as input", key);
		}
		if (!sql_type_list.empty()) {
			throw BinderException("read_csv column_types/types/dtypes can only be supplied once");
		}
		vector<string> sql_type_names;
		if (child_type.id() == LogicalTypeId::STRUCT) {
			auto &struct_children = StructValue::GetChildren(val);
			D_ASSERT(StructType::GetChildCount(child_type) == struct_children.size());
			for (idx_t i = 0; i < struct_children.size(); i++) {
				auto &name = StructType::GetChildName(child_type, i);
				auto &val = struct_children[i];
				if (val.type().id() != LogicalTypeId::VARCHAR) {
					throw BinderException("read_csv %s requires a type specification as string", key);
				}
				sql_type_names.push_back(StringValue::Get(val));
				sql_types_per_column[name] = i;
			}
		} else {
			auto &list_child = ListType::GetChildType(child_type);
			if (list_child.id() != LogicalTypeId::VARCHAR) {
				throw BinderException("read_csv %s requires a list of types (varchar) as input", key);
			}
			auto &children = ListValue::GetChildren(val);
			for (auto &child : children) {
				sql_type_names.push_back(StringValue::Get(child));
			}
		}
		sql_type_list.reserve(sql_type_names.size());
		for (auto &sql_type : sql_type_names) {
			auto def_type = TransformStringToLogicalType(sql_type, context);
			if (def_type.id() == LogicalTypeId::USER) {
				throw BinderException("Unrecognized type \"%s\" for read_csv %s definition", sql_type, key);
			}
			sql_type_list.push_back(std::move(def_type));
		}
	} else if (loption == "all_varchar") {
		all_varchar = GetBooleanValue(loption, val);
	} else if (loption == "normalize_names") {
		normalize_names = GetBooleanValue(loption, val);
	} else {
		SetReadOption(loption, val, name_list);
	}
}